

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O1

void __thiscall test_app::test_views(test_app *this)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  ostringstream oss;
  master m;
  string asStack_2e8 [32];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  string local_288 [11];
  undefined **local_110 [4];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  base_content local_70 [32];
  pointer local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Testing different views",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  data::master::master((master *)local_110);
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"view_x","");
  cppcms::application::render(this,local_2a8,(master *)local_110);
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0]);
  }
  str_abi_cxx11_(local_288,this);
  iVar1 = std::__cxx11::string::compare((char *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288[0]._M_dataplus._M_p != &local_288[0].field_2) {
    operator_delete(local_288[0]._M_dataplus._M_p);
  }
  if (iVar1 == 0) {
    local_2c8[0] = local_2b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"view_y","");
    cppcms::application::render(this,local_2c8,(master *)local_110);
    if (local_2c8[0] != local_2b8) {
      operator_delete(local_2c8[0]);
    }
    str_abi_cxx11_(local_288,this);
    iVar1 = std::__cxx11::string::compare((char *)local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288[0]._M_dataplus._M_p != &local_288[0].field_2) {
      operator_delete(local_288[0]._M_dataplus._M_p);
    }
    if (iVar1 == 0) {
      local_110[0] = &PTR__master_0011ac08;
      if (local_50 != (pointer)0x0) {
        operator_delete(local_50);
      }
      cppcms::base_content::~base_content(&(((master *)local_110)->h).super_base_content);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((master *)local_110)->name1 + 0x10U)) {
        operator_delete(local_90._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((master *)local_110)->skin2 + 0x10U)) {
        operator_delete(local_b0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((master *)local_110)->skin1 + 0x10U)) {
        operator_delete(local_d0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((master *)local_110)->text + 0x10U)) {
        operator_delete(local_f0._M_p);
      }
      cppcms::base_content::~base_content((base_content *)local_110);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/tc_test.cpp"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_288,0xd5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," str()==\"view y\"",0x10);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,asStack_2e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_288,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/tc_test.cpp"
             ,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_288,0xd3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," str()==\"view x\"",0x10);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,asStack_2e8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_views()
	{
		std::cout << "- Testing different views" << std::endl;
		data::master m;
		render("view_x",m);
		TEST(str()=="view x");
		render("view_y",m);
		TEST(str()=="view y");
	}